

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

bool __thiscall SQClosure::Save(SQClosure *this,SQVM *v,SQUserPointer up,SQWRITEFUNC write)

{
  bool bVar1;
  SQWRITEFUNC write_local;
  SQUserPointer up_local;
  SQVM *v_local;
  SQClosure *this_local;
  
  bVar1 = WriteTag(v,write,up,0x53514952);
  if (bVar1) {
    bVar1 = WriteTag(v,write,up,1);
    if (bVar1) {
      bVar1 = WriteTag(v,write,up,8);
      if (bVar1) {
        bVar1 = WriteTag(v,write,up,4);
        if (bVar1) {
          bVar1 = SQFunctionProto::Save(this->_function,v,up,write);
          if (bVar1) {
            bVar1 = WriteTag(v,write,up,0x5441494c);
            if (bVar1) {
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SQClosure::Save(SQVM *v,SQUserPointer up,SQWRITEFUNC write)
{
    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_HEAD));
    _CHECK_IO(WriteTag(v,write,up,sizeof(SQChar)));
    _CHECK_IO(WriteTag(v,write,up,sizeof(SQInteger)));
    _CHECK_IO(WriteTag(v,write,up,sizeof(SQFloat)));
    _CHECK_IO(_function->Save(v,up,write));
    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_TAIL));
    return true;
}